

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

bool __thiscall tf::TaskQueue<tf::Node_*>::empty(TaskQueue<tf::Node_*> *this)

{
  long lVar1;
  int64_t t;
  int64_t b;
  TaskQueue<tf::Node_*> *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(relaxed,__memory_order_mask);
  lVar1 = (this->_bottom).super___atomic_base<long>._M_i;
  std::operator&(relaxed,__memory_order_mask);
  return lVar1 <= (this->_top).super___atomic_base<long>._M_i;
}

Assistant:

bool TaskQueue<T>::empty() const noexcept {
  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_relaxed);
  return (b <= t);
  // && (_cache.load(std::memory_order_relaxed) == nullptr);
}